

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

_Bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemFlags extra_flags)

{
  short *psVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  ImGuiNavLayer IVar9;
  ImGuiWindow_conflict *window_00;
  ImGuiWindow_conflict *pIVar10;
  float fVar11;
  ImGuiContext_conflict1 *pIVar12;
  _Bool _Var13;
  _Bool _Var14;
  uint uVar15;
  ImGuiID id_1;
  ImGuiNavItemData *result;
  ImGuiContext_conflict1 *g;
  ImGuiWindow_conflict *window;
  float fVar16;
  ImVec2 IVar17;
  ImVec2 IVar18;
  
  pIVar12 = GImGui;
  window_00 = GImGui->CurrentWindow;
  (GImGui->LastItemData).ID = id;
  IVar17 = bb->Max;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  (pIVar12->LastItemData).Rect.Min = bb->Min;
  (pIVar12->LastItemData).Rect.Max = IVar17;
  IVar17 = nav_bb_arg->Max;
  (pIVar12->LastItemData).NavRect.Min = nav_bb_arg->Min;
  (pIVar12->LastItemData).NavRect.Max = IVar17;
  uVar15 = pIVar12->CurrentItemFlags | extra_flags;
  (pIVar12->LastItemData).InFlags = uVar15;
  (pIVar12->LastItemData).StatusFlags = 0;
  if (id == 0) goto LAB_001d541e;
  IVar9 = (window_00->DC).NavLayerCurrent;
  psVar1 = &(window_00->DC).NavLayersActiveMaskNext;
  *psVar1 = *psVar1 | (ushort)(1 << ((byte)IVar9 & 0x1f));
  if ((((pIVar12->NavId != id) && (pIVar12->NavAnyRequest != true)) ||
      (pIVar10 = pIVar12->NavWindow, pIVar10->RootWindowForNav != window_00->RootWindowForNav)) ||
     ((window_00 != pIVar10 && (((uint)(pIVar10->Flags | window_00->Flags) >> 0x17 & 1) == 0))))
  goto LAB_001d541e;
  fVar4 = (pIVar12->LastItemData).NavRect.Min.x;
  fVar5 = (pIVar12->LastItemData).NavRect.Min.y;
  fVar6 = (pIVar12->LastItemData).NavRect.Max.x;
  fVar7 = (pIVar12->LastItemData).NavRect.Max.y;
  if ((pIVar12->NavInitRequest == true) && (pIVar12->NavLayer == IVar9)) {
    if (((uVar15 & 0x14) == 0) || (pIVar12->NavInitResultId == 0)) {
      pIVar12->NavInitResultId = id;
      fVar16 = (window_00->Pos).x;
      fVar8 = (window_00->Pos).y;
      IVar17.x = fVar4 - fVar16;
      IVar17.y = fVar5 - fVar8;
      IVar18.x = fVar6 - fVar16;
      IVar18.y = fVar7 - fVar8;
      (pIVar12->NavInitResultRectRel).Min = IVar17;
      (pIVar12->NavInitResultRectRel).Max = IVar18;
    }
    if ((uVar15 & 0x14) == 0) {
      pIVar12->NavInitRequest = false;
      if (pIVar12->NavMoveScoringItems == false) {
        pIVar12->NavAnyRequest = false;
      }
      else {
        pIVar12->NavAnyRequest = true;
        if (pIVar12->NavWindow == (ImGuiWindow_conflict *)0x0) {
          __assert_fail("g.NavWindow != __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                        ,0x2664,"void ImGui::NavUpdateAnyRequestFlag()");
        }
      }
    }
  }
  if (pIVar12->NavMoveScoringItems == true) {
    if ((uVar15 >> 8 & 1) != 0) {
      pIVar12->NavTabbingInputableRemaining = pIVar12->NavTabbingInputableRemaining + -1;
    }
    if (pIVar12->NavId == id) {
      if (((byte)pIVar12->NavMoveFlags >> 4 & (uVar15 & 0xc) == 0) != 0) {
LAB_001d55b1:
        result = &pIVar12->NavMoveResultOther;
        if (window_00 == pIVar12->NavWindow) {
          result = &pIVar12->NavMoveResultLocal;
        }
        if ((pIVar12->NavMoveFlags & 0x200) == 0) {
          _Var13 = NavScoreItem(result);
          if (_Var13) {
            NavApplyItemToResult(result);
          }
          if (((((pIVar12->NavMoveFlags & 0x20) != 0) &&
               (fVar16 = (window_00->ClipRect).Max.y, fVar5 < fVar16)) &&
              (fVar8 = (window_00->ClipRect).Min.y, fVar8 < fVar7)) &&
             ((fVar4 < (window_00->ClipRect).Max.x &&
              ((window_00->ClipRect).Min.x <= fVar6 && fVar6 != (window_00->ClipRect).Min.x)))) {
            fVar11 = fVar16;
            if (fVar7 <= fVar16) {
              fVar11 = fVar7;
            }
            if (fVar5 <= fVar16) {
              fVar16 = fVar5;
            }
            if ((fVar7 - fVar5) * 0.7 <=
                (float)(-(uint)(fVar7 < fVar8) & (uint)fVar8 |
                       ~-(uint)(fVar7 < fVar8) & (uint)fVar11) -
                (float)(-(uint)(fVar5 < fVar8) & (uint)fVar8 |
                       ~-(uint)(fVar5 < fVar8) & (uint)fVar16)) {
              _Var13 = NavScoreItem(&pIVar12->NavMoveResultLocalVisible);
              if (_Var13) {
                NavApplyItemToResult(&pIVar12->NavMoveResultLocalVisible);
              }
            }
          }
        }
        else if (pIVar12->NavTabbingInputableRemaining == 0) {
          NavMoveRequestResolveWithLastItem();
        }
      }
    }
    else if ((uVar15 & 0xc) == 0) goto LAB_001d55b1;
  }
  if (pIVar12->NavId == id) {
    pIVar12->NavWindow = window_00;
    IVar9 = (window_00->DC).NavLayerCurrent;
    pIVar12->NavLayer = IVar9;
    pIVar12->NavFocusScopeId = (window_00->DC).NavFocusScopeIdCurrent;
    pIVar12->NavIdIsAlive = true;
    fVar16 = (window_00->Pos).x;
    fVar8 = (window_00->Pos).y;
    pIVar3 = window_00->NavRectRel + IVar9;
    (pIVar3->Min).x = fVar4 - fVar16;
    (pIVar3->Min).y = fVar5 - fVar8;
    (pIVar3->Max).x = fVar6 - fVar16;
    (pIVar3->Max).y = fVar7 - fVar8;
  }
LAB_001d541e:
  (pIVar12->NextItemData).Flags = 0;
  _Var13 = IsClippedEx(bb,id);
  if (!_Var13) {
    if (((uint)extra_flags >> 8 & 1) != 0) {
      ItemInputable(window_00,id);
    }
    _Var14 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (_Var14) {
      pIVar2 = &(pIVar12->LastItemData).StatusFlags;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
    }
  }
  return !_Var13;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Set item data
    // (DisplayRect is left untouched, made valid when ImGuiItemStatusFlags_HasDisplayRect is set)
    g.LastItemData.ID = id;
    g.LastItemData.Rect = bb;
    g.LastItemData.NavRect = nav_bb_arg ? *nav_bb_arg : bb;
    g.LastItemData.InFlags = g.CurrentItemFlags | extra_flags;
    g.LastItemData.StatusFlags = ImGuiItemStatusFlags_None;

    // Directional navigation processing
    if (id != 0)
    {
        // Runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem();

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // [WIP] Tab stop handling (previously was using internal FocusableItemRegister() api)
    // FIXME-NAV: We would now want to move this before the clipping test, but this would require being able to scroll and currently this would mean an extra frame. (#4079, #343)
    if (extra_flags & ImGuiItemFlags_Inputable)
        ItemInputable(window, id);

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}